

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

bool __thiscall flatbuffers::java::JavaGenerator::generate(JavaGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EnumDef *enum_def;
  StructDef *struct_def;
  bool bVar2;
  Parser *pPVar3;
  long *plVar4;
  size_type *psVar5;
  pointer ppSVar6;
  pointer ppEVar7;
  string enumcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> class_name;
  string one_file_code;
  string local_b8;
  string local_98;
  string local_78;
  IdlNamer *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  pPVar3 = (this->super_BaseGenerator).parser_;
  this->cur_name_space_ = pPVar3->current_namespace_;
  ppEVar7 = (pPVar3->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar7 !=
      (pPVar3->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_b8.field_2;
    local_58 = &this->namer_;
    do {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      enum_def = *ppEVar7;
      if ((pPVar3->opts).one_file == false) {
        this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      GenEnum(this,enum_def,&local_b8);
      if ((((this->super_BaseGenerator).parser_)->opts).one_file != true) {
        bVar2 = SaveType(this,(string *)enum_def,(enum_def->super_Definition).defined_namespace,
                         &local_b8,false);
        if (bVar2) goto LAB_0021a7ab;
LAB_0021aafc:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar1) goto LAB_0021ab12;
        goto LAB_0021ab05;
      }
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8._M_dataplus._M_p);
LAB_0021a7ab:
      if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) &&
         (enum_def->is_union == true)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x374c6b);
        GenEnum_ObjectAPI(this,enum_def,&local_b8);
        (*(local_58->super_Namer)._vptr_Namer[0xf])(local_50,local_58,enum_def);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98.field_2._8_8_ = plVar4[3];
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_98._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8._M_dataplus._M_p);
        }
        else {
          bVar2 = SaveType(this,&local_98,(enum_def->super_Definition).defined_namespace,&local_b8,
                           false);
          if (!bVar2) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0021aafc;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      ppEVar7 = ppEVar7 + 1;
      pPVar3 = (this->super_BaseGenerator).parser_;
    } while (ppEVar7 !=
             (pPVar3->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar3 = (this->super_BaseGenerator).parser_;
  ppSVar6 = (pPVar3->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar6 !=
      (pPVar3->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_b8.field_2;
    do {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      struct_def = *ppSVar6;
      if ((pPVar3->opts).one_file == false) {
        this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      GenStruct(this,struct_def,&local_b8,&pPVar3->opts);
      if ((((this->super_BaseGenerator).parser_)->opts).one_file != true) {
        bVar2 = SaveType(this,(string *)struct_def,(struct_def->super_Definition).defined_namespace,
                         &local_b8,true);
        if (bVar2) goto LAB_0021a9b1;
LAB_0021aad5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
LAB_0021ab05:
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
LAB_0021ab12:
        bVar2 = false;
        goto LAB_0021ab14;
      }
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8._M_dataplus._M_p);
LAB_0021a9b1:
      if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x374c6b);
        GenStruct_ObjectAPI(this,struct_def,&local_b8);
        (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_98,&this->namer_,struct_def);
        if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8._M_dataplus._M_p);
        }
        else {
          bVar2 = SaveType(this,&local_98,(struct_def->super_Definition).defined_namespace,&local_b8
                           ,true);
          if (!bVar2) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0021aad5;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      ppSVar6 = ppSVar6 + 1;
      pPVar3 = (this->super_BaseGenerator).parser_;
    } while (ppSVar6 !=
             (pPVar3->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar3 = (this->super_BaseGenerator).parser_;
  bVar2 = true;
  if ((pPVar3->opts).one_file == true) {
    bVar2 = SaveType(this,(this->super_BaseGenerator).file_name_,pPVar3->current_namespace_,
                     &local_78,true);
  }
LAB_0021ab14:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, enumcode);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      /* needs_includes= */ false))
          return false;
      }

      if (parser_.opts.generate_object_based_api && enum_def.is_union) {
        enumcode = "";
        GenEnum_ObjectAPI(enum_def, enumcode);
        auto class_name = namer_.Type(enum_def) + "Union";
        if (parser_.opts.one_file) {
          one_file_code += enumcode;
        } else {
          if (!SaveType(class_name, *enum_def.defined_namespace, enumcode,
                        /* needs_includes= */ false))
            return false;
        }
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, declcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      /* needs_includes= */ true))
          return false;
      }

      if (parser_.opts.generate_object_based_api) {
        declcode = "";
        GenStruct_ObjectAPI(struct_def, declcode);
        auto class_name = namer_.ObjectType(struct_def);
        if (parser_.opts.one_file) {
          one_file_code += declcode;
        } else {
          if (!SaveType(class_name, *struct_def.defined_namespace, declcode,
                        /* needs_includes= */ true))
            return false;
        }
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      /* needs_includes= */ true);
    }
    return true;
  }